

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipc.c
# Opt level: O0

pchar * p_ipc_unix_get_temp_dir(void)

{
  pchar *__s;
  size_t sVar1;
  size_t local_28;
  psize len;
  pchar *ret;
  pchar *str;
  
  __s = p_strdup("/tmp");
  sVar1 = strlen(__s);
  do {
    local_28 = sVar1;
    sVar1 = local_28 - 1;
  } while (__s[local_28 - 1] == '/');
  __s[local_28] = '\0';
  str = (pchar *)p_malloc0(local_28 + 2);
  if (str == (char *)0x0) {
    p_free(__s);
    str = (pchar *)0x0;
  }
  else {
    strcpy(str,__s);
    strcat(str,"/");
  }
  return str;
}

Assistant:

pchar *
p_ipc_unix_get_temp_dir (void)
{
	pchar	*str, *ret;
	psize	len;

#ifdef P_tmpdir
	if (strlen (P_tmpdir) > 0)
		str = p_strdup (P_tmpdir);
	else
		return p_strdup ("/tmp/");
#else
	const pchar *tmp_env;

	tmp_env = getenv ("TMPDIR");

	if (tmp_env != NULL)
		str = p_strdup (tmp_env);
	else
		return p_strdup ("/tmp/");
#endif /* P_tmpdir */

	/* Now we need to ensure that we have only the one trailing slash */
	len = strlen (str);
	while (*(str + --len) == '/')
		;
	*(str + ++len) = '\0';

	/* len + / + zero symbol */
	if (P_UNLIKELY ((ret = p_malloc0 (len + 2)) == NULL)) {
		p_free (str);
		return NULL;
	}

	strcpy (ret, str);
	strcat (ret, "/");

	return ret;
}